

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfGenericInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::GenericInputFile::readMagicNumberAndVersionField
          (GenericInputFile *this,IStream *is,int *version)

{
  ostream *poVar1;
  InputExc *pIVar2;
  stringstream _iex_throw_s;
  ostream local_198 [376];
  
  (*is->_vptr_IStream[3])(is,&_iex_throw_s,4);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,version);
  if (__iex_throw_s != 0x1312f76) {
    pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar2,"File is not an image file.");
    __cxa_throw(pIVar2,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  if ((char)*version == '\x02') {
    if ((*version & 0xffffe100U) == 0) {
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    std::operator<<(local_198,
                    "The file format version number\'s flag field contains unrecognized flags.");
    pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar2,(stringstream *)&_iex_throw_s);
    __cxa_throw(pIVar2,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar1 = std::operator<<(local_198,"Cannot read version ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(uint)(byte)*version);
  poVar1 = std::operator<<(poVar1," image files.  Current file format version is ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,2);
  std::operator<<(poVar1,".");
  pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar2,(stringstream *)&_iex_throw_s);
  __cxa_throw(pIVar2,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

void GenericInputFile::readMagicNumberAndVersionField(OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int& version)
{
    //
    // Read the magic number and the file format version number.
    // Then check if we can read the rest of this file.
    //

    int magic;

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, magic);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, version);

    if (magic != MAGIC)
    {
        throw IEX_NAMESPACE::InputExc ("File is not an image file.");
    }

    if (getVersion (version) != EXR_VERSION)
    {
        THROW (IEX_NAMESPACE::InputExc, "Cannot read "
                              "version " << getVersion (version) << " "
                              "image files.  Current file format version "
                              "is " << EXR_VERSION << ".");
    }

    if (!supportsFlags (getFlags (version)))
    {
        THROW (IEX_NAMESPACE::InputExc, "The file format version number's flag field "
                              "contains unrecognized flags.");
    }
}